

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O3

void __thiscall fw::Texture::Texture(Texture *this,istream *stream,string *filepath)

{
  pointer pcVar1;
  byte bVar2;
  int iVar3;
  Writer *pWVar4;
  float *image;
  stbi_uc *image_00;
  int *comp;
  int height;
  int width;
  int components;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  int local_c4;
  int local_c0;
  int local_bc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  Writer local_a0;
  
  this->_vptr_Texture = (_func_int **)&PTR__Texture_001f5c70;
  (this->_filepath)._M_dataplus._M_p = (pointer)&(this->_filepath).field_2;
  pcVar1 = (filepath->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_filepath,pcVar1,pcVar1 + filepath->_M_string_length);
  loadStream(&local_b8,stream);
  iVar3 = stbi_is_hdr_from_memory
                    (local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (int)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                     (int)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  stbi_set_flip_vertically_on_load(1);
  if (iVar3 == 0) {
    image_00 = stbi_load_from_memory
                         (local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (int)local_b8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                          (int)local_b8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,&local_c0,&local_c4,
                          &local_bc,0);
    loadTextureLDR(this,image_00,local_c0,local_c4,local_bc);
    stbi_image_free(image_00);
  }
  else {
    local_a0._vptr_Writer = (_func_int **)&PTR__Writer_001f54f0;
    local_a0.m_level = Info;
    local_a0.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/source/framework/Texture.cpp"
    ;
    local_a0.m_line = 0x23;
    local_a0.m_func = "fw::Texture::Texture(std::istream &, const std::string &)";
    local_a0.m_verboseLevel = 0;
    local_a0.m_logger = (Logger *)0x0;
    local_a0.m_proceed = false;
    local_a0.m_messageBuilder.m_logger = (Logger *)0x0;
    local_a0.m_messageBuilder.m_containerLogSeperator = "";
    local_a0.m_dispatchAction = NormalLog;
    local_a0.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a0.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a0.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWVar4 = el::base::Writer::construct(&local_a0,1,"framework");
    bVar2 = pWVar4->m_proceed;
    if ((bool)bVar2 == true) {
      el::base::MessageBuilder::operator<<(&pWVar4->m_messageBuilder,"Texture ");
      bVar2 = pWVar4->m_proceed;
    }
    if ((bVar2 & 1) != 0) {
      el::base::MessageBuilder::operator<<(&pWVar4->m_messageBuilder,(filepath->_M_dataplus)._M_p);
      bVar2 = pWVar4->m_proceed;
    }
    if ((bVar2 & 1) != 0) {
      el::base::MessageBuilder::operator<<(&pWVar4->m_messageBuilder," is high dynamic range.");
    }
    el::base::Writer::~Writer(&local_a0);
    comp = &local_bc;
    image = stbi_loadf_from_memory
                      (local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (int)local_b8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                       (int)local_b8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,&local_c0,&local_c4,comp,0);
    loadTextureHDR(this,image,local_c0,local_c4,(int)comp);
    stbi_image_free(image);
  }
  if (local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (stbi_uc *)0x0) {
    operator_delete(local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

Texture::Texture(
    std::istream& stream,
    const std::string& filepath
):
    _filepath{filepath}
{
    auto buffer = loadStream(stream);
    bool isHDR = stbi_is_hdr_from_memory(buffer.data(), buffer.size());

    stbi_set_flip_vertically_on_load(true);
    int width, height, components;

    if (isHDR)
    {
        LOG(INFO) << "Texture " << filepath << " is high dynamic range.";

        auto image = stbi_loadf_from_memory(
            buffer.data(), buffer.size(), &width, &height, &components, 0
        );

        loadTextureHDR(image, width, height, components);
        stbi_image_free(image);
    }
    else
    {
        auto image = stbi_load_from_memory(
            buffer.data(), buffer.size(), &width, &height, &components, 0
        );

        loadTextureLDR(image, width, height, components);
        stbi_image_free(image);
    }
}